

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_alloc.c
# Opt level: O0

int simple_compare_function(void *l,void *r)

{
  uintptr_t rp;
  uintptr_t lp;
  void *r_local;
  void *l_local;
  
  if (l < r) {
    l_local._4_4_ = -1;
  }
  else if (r < l) {
    l_local._4_4_ = 1;
  }
  else {
    l_local._4_4_ = 0;
  }
  return l_local._4_4_;
}

Assistant:

static int
simple_compare_function(const void *l, const void *r)
{
    DW_TSHASHTYPE lp = (DW_TSHASHTYPE)(uintptr_t)l;
    DW_TSHASHTYPE rp = (DW_TSHASHTYPE)(uintptr_t)r;
    if (lp < rp) {
        return -1;
    }
    if (lp > rp) {
        return 1;
    }
    return 0;
}